

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O0

bool __thiscall
hwl::if_stmt::anon_class_24_3_6f7e9f14::operator()(anon_class_24_3_6f7e9f14 *this,state *ps)

{
  Statement *in_RDI;
  Statement *in_stack_ffffffffffffff70;
  vector<hwl::Statement,_std::allocator<hwl::Statement>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  Statement *in_stack_ffffffffffffff90;
  string local_68 [32];
  vector<hwl::Statement,_std::allocator<hwl::Statement>_> *in_stack_ffffffffffffffb8;
  vector<hwl::Statement,_std::allocator<hwl::Statement>_> *in_stack_ffffffffffffffc0;
  
  std::__cxx11::string::string(local_68,(string *)(in_RDI->call)._M_string_length);
  std::vector<hwl::Statement,_std::allocator<hwl::Statement>_>::vector
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  Statement::Statement
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  Statement::operator=(in_stack_ffffffffffffff70,in_RDI);
  Statement::~Statement(in_stack_ffffffffffffff70);
  std::vector<hwl::Statement,_std::allocator<hwl::Statement>_>::~vector(in_stack_ffffffffffffff80);
  std::__cxx11::string::~string(local_68);
  return true;
}

Assistant:

bool command(parser::state& ps, Command             & psVal) {
		std::string s;
		Variable             v;

		return parser::memoize(10, psVal, parser::some(
			parser::choice({
				
					parser::sequence({
						parser::capture(s, parser::memoize_some(11, 
							parser::sequence({
								parser::look_not(parser::literal('$')),
								parser::any()}))),
						[&](parser::state& ps) { psVal.add_string(s);    return true; }}),
				
					parser::sequence({
						parser::bind(v, variable),
						[&](parser::state& ps) { psVal.add_variable(v);  return true; }})})))(ps);
	}